

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O1

void __thiscall
TEST_MockReturnValueTest_WhenNoDoubleReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue_Test
::testBody(TEST_MockReturnValueTest_WhenNoDoubleReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  undefined4 extraout_var;
  TestTerminator *pTVar4;
  undefined8 extraout_XMM0_Qa;
  SimpleString SStack_38;
  undefined8 local_28;
  SimpleString local_20;
  
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&SStack_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_20);
  local_28 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x138))
                       (0x401ecccccccccccd,(long *)CONCAT44(extraout_var,iVar1));
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x15])
            (0x401ecccccccccccd,local_28,0x3fa999999999999a,pUVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xe8,pTVar4);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&SStack_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x19])(0x401ecccccccccccd,pMVar2);
  local_28 = extraout_XMM0_Qa;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x15])
            (0x401ecccccccccccd,local_28,0x3fa999999999999a,pUVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xe9,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenNoDoubleReturnValueIsExpectedButThereIsADefaultShouldlUseTheDefaultValue)
{
    double default_return_value = 7.7;
    mock().expectOneCall("foo");
    DOUBLES_EQUAL(default_return_value, mock().actualCall("foo").returnDoubleValueOrDefault(default_return_value), 0.05);
    DOUBLES_EQUAL(default_return_value, mock().returnDoubleValueOrDefault(default_return_value), 0.05);
}